

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

int32_t CVmObjBigNum::ext_to_int(char *ext,int *ov)

{
  int iVar1;
  undefined4 *in_RSI;
  char *in_RDI;
  int *unaff_retaddr;
  char *in_stack_00000008;
  uint32_t m;
  undefined4 local_4;
  
  *in_RSI = 0;
  local_4 = convert_to_int_base(in_stack_00000008,unaff_retaddr);
  iVar1 = get_neg(in_RDI);
  if (iVar1 == 0) {
    if (0x7fffffff < local_4) {
      *in_RSI = 1;
    }
  }
  else {
    if (0x80000000 < local_4) {
      *in_RSI = 1;
    }
    local_4 = -local_4;
  }
  return local_4;
}

Assistant:

int32_t CVmObjBigNum::ext_to_int(const char *ext, int &ov)
{        
    /* get the magnitude */
    ov = FALSE;
    uint32_t m = convert_to_int_base(ext, ov);

    /* apply the sign and check limits */
    if (get_neg(ext))
    {
        /* 
         *   a T3 VM int is a 32-bit signed value (irrespective of the local
         *   platform int size), so the magnitude of a negative value can't
         *   exceed 2147483648
         */
        if (m > 2147483648U)
            ov = TRUE;

        /* negate the number and return it */
        return -(long)m;
    }
    else
    {
        /* 
         *   a T3 VM positive int value can't exceed 2147483647L (regardless
         *   of the local platform int size) 
         */
        if (m > 2147483647U)
            ov = TRUE;

        /* return the value */
        return (long)m;
    }
}